

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall
icu_63::Calendar::Calendar(Calendar *this,TimeZone *zone,Locale *aLocale,UErrorCode *success)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Calendar_003d2c58;
  this->fIsTimeSet = '\0';
  this->fAreFieldsSet = '\0';
  this->fAreAllFieldsSet = '\0';
  this->fAreFieldsVirtuallySet = '\0';
  this->fNextStamp = 2;
  this->fTime = 0.0;
  this->fLenient = '\x01';
  this->validLocale[0] = '\0';
  this->actualLocale[0] = '\0';
  this->fZone = (TimeZone *)0x0;
  this->fRepeatedWallTime = UCAL_WALLTIME_LAST;
  this->fSkippedWallTime = UCAL_WALLTIME_LAST;
  if (*success < U_ILLEGAL_ARGUMENT_ERROR) {
    if (zone == (TimeZone *)0x0) {
      *success = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      this->fIsSet[0x13] = '\0';
      this->fIsSet[0x14] = '\0';
      this->fIsSet[0x15] = '\0';
      this->fIsSet[0x16] = '\0';
      this->fIsSet[4] = '\0';
      this->fIsSet[5] = '\0';
      this->fIsSet[6] = '\0';
      this->fIsSet[7] = '\0';
      this->fIsSet[8] = '\0';
      this->fIsSet[9] = '\0';
      this->fIsSet[10] = '\0';
      this->fIsSet[0xb] = '\0';
      this->fIsSet[0xc] = '\0';
      this->fIsSet[0xd] = '\0';
      this->fIsSet[0xe] = '\0';
      this->fIsSet[0xf] = '\0';
      this->fIsSet[0x10] = '\0';
      this->fIsSet[0x11] = '\0';
      this->fIsSet[0x12] = '\0';
      this->fIsSet[0x13] = '\0';
      this->fFields[0x14] = 0;
      this->fFields[0x15] = 0;
      *(undefined8 *)(this->fFields + 0x16) = 0;
      this->fFields[0x10] = 0;
      this->fFields[0x11] = 0;
      this->fFields[0x12] = 0;
      this->fFields[0x13] = 0;
      this->fFields[0xc] = 0;
      this->fFields[0xd] = 0;
      this->fFields[0xe] = 0;
      this->fFields[0xf] = 0;
      this->fFields[8] = 0;
      this->fFields[9] = 0;
      this->fFields[10] = 0;
      this->fFields[0xb] = 0;
      this->fFields[4] = 0;
      this->fFields[5] = 0;
      this->fFields[6] = 0;
      this->fFields[7] = 0;
      this->fFields[0] = 0;
      this->fFields[1] = 0;
      this->fFields[2] = 0;
      this->fFields[3] = 0;
      this->fStamp[0] = 0;
      this->fStamp[1] = 0;
      this->fStamp[2] = 0;
      this->fStamp[3] = 0;
      this->fStamp[4] = 0;
      this->fStamp[5] = 0;
      this->fStamp[6] = 0;
      this->fStamp[7] = 0;
      this->fStamp[8] = 0;
      this->fStamp[9] = 0;
      this->fStamp[10] = 0;
      this->fStamp[0xb] = 0;
      this->fStamp[0xc] = 0;
      this->fStamp[0xd] = 0;
      this->fStamp[0xe] = 0;
      this->fStamp[0xf] = 0;
      this->fStamp[0x10] = 0;
      this->fStamp[0x11] = 0;
      this->fStamp[0x12] = 0;
      this->fStamp[0x13] = 0;
      this->fStamp[0x13] = 0;
      this->fStamp[0x14] = 0;
      this->fStamp[0x15] = 0;
      this->fStamp[0x16] = 0;
      this->fIsTimeSet = '\0';
      this->fAreFieldsSet = '\0';
      this->fAreAllFieldsSet = '\0';
      this->fAreFieldsVirtuallySet = '\0';
      this->fZone = zone;
      setWeekData(this,aLocale,(char *)0x0,success);
    }
  }
  return;
}

Assistant:

Calendar::Calendar(TimeZone* zone, const Locale& aLocale, UErrorCode& success)
:   UObject(),
fIsTimeSet(FALSE),
fAreFieldsSet(FALSE),
fAreAllFieldsSet(FALSE),
fAreFieldsVirtuallySet(FALSE),
fNextStamp((int32_t)kMinimumUserStamp),
fTime(0),
fLenient(TRUE),
fZone(NULL),
fRepeatedWallTime(UCAL_WALLTIME_LAST),
fSkippedWallTime(UCAL_WALLTIME_LAST)
{
    validLocale[0] = 0;
    actualLocale[0] = 0;
    if (U_FAILURE(success)) {
        return;
    }
    if(zone == 0) {
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d: ILLEGAL ARG because timezone cannot be 0\n",
            __FILE__, __LINE__);
#endif
        success = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    clear();
    fZone = zone;
    setWeekData(aLocale, NULL, success);
}